

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int jsonEachNext(sqlite3_vtab_cursor *cur)

{
  int *piVar1;
  char **ppcVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  u32 uVar8;
  u32 uVar9;
  uint uVar10;
  ulong in_RAX;
  sqlite3_vtab *psVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint *puVar16;
  bool bVar17;
  u32 sz;
  u32 sz_1;
  undefined8 local_38;
  
  if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
    local_38 = in_RAX & 0xffffffff;
    uVar8 = jsonSkipLabel((JsonEachCursor *)cur);
    uVar9 = jsonbPayloadSize((JsonParse *)(cur + 0x18),uVar8,(u32 *)((long)&local_38 + 4));
    *(u32 *)((long)&cur[1].pVtab + 4) = uVar9 + uVar8 + local_38._4_4_;
    iVar12 = 0;
    goto LAB_001af502;
  }
  local_38 = in_RAX & 0xffffffff00000000;
  uVar7 = jsonSkipLabel((JsonEachCursor *)cur);
  bVar6 = *(byte *)((long)&(cur[0x18].pVtab)->pModule + (ulong)uVar7);
  uVar8 = jsonbPayloadSize((JsonParse *)(cur + 0x18),uVar7,(u32 *)&local_38);
  if ((byte)((bVar6 & 0xf) - 0xb) < 2) {
    if (*(uint *)((long)&cur[3].pVtab + 4) < *(uint *)&cur[4].pVtab) {
LAB_001af3b1:
      psVar11 = cur[5].pVtab;
      uVar13 = (ulong)*(uint *)((long)&cur[3].pVtab + 4);
      *(undefined4 *)&psVar11[uVar13].pModule = *(undefined4 *)((long)&cur[1].pVtab + 4);
      *(uint *)((long)&psVar11[uVar13].pModule + 4) = uVar7;
      iVar12 = 0;
      psVar11[uVar13].nRef = (u32)local_38 + uVar8 + uVar7;
      psVar11[uVar13].zErrMsg = (char *)0xffffffffffffffff;
      *(undefined4 *)&psVar11[uVar13].field_0xc = *(undefined4 *)&cur[10].pVtab;
      if ((uVar13 != 0) && (*(char *)&cur[3].pVtab != '\0')) {
        jsonAppendPathName((JsonEachCursor *)cur);
        iVar12 = 7;
        if (*(char *)((long)&cur[0xb].pVtab + 1) == '\0') {
          iVar12 = 0;
        }
      }
      piVar1 = (int *)((long)&cur[3].pVtab + 4);
      *piVar1 = *piVar1 + 1;
      *(u32 *)((long)&cur[1].pVtab + 4) = uVar8 + uVar7;
      bVar4 = true;
    }
    else {
      uVar10 = *(uint *)&cur[4].pVtab * 2 + 3;
      psVar11 = (sqlite3_vtab *)
                sqlite3DbRealloc((sqlite3 *)cur[6].pVtab,cur[5].pVtab,(ulong)uVar10 * 0x18);
      if (psVar11 != (sqlite3_vtab *)0x0) {
        *(uint *)&cur[4].pVtab = uVar10;
        cur[5].pVtab = psVar11;
        goto LAB_001af3b1;
      }
      bVar4 = false;
      iVar12 = 0;
    }
    if (bVar4) goto LAB_001af458;
    bVar5 = false;
  }
  else {
    *(u32 *)((long)&cur[1].pVtab + 4) = uVar8 + uVar7 + (u32)local_38;
    bVar4 = false;
    iVar12 = 0;
LAB_001af458:
    bVar4 = !bVar4;
    iVar15 = *(int *)((long)&cur[3].pVtab + 4);
    bVar17 = iVar15 == 0;
    if (!bVar17) {
      uVar7 = *(uint *)((long)&cur[1].pVtab + 4);
      psVar11 = cur[5].pVtab;
      if ((uint)psVar11[iVar15 - 1U].nRef <= uVar7) {
        puVar16 = (uint *)&psVar11[iVar15 - 1U].field_0xc;
        iVar14 = -iVar15;
        uVar10 = iVar15 - 2;
        do {
          uVar3 = *puVar16;
          bVar17 = iVar14 == -1;
          if (bVar17) {
            *(undefined4 *)((long)&cur[3].pVtab + 4) = 0;
            cur[10].pVtab = (sqlite3_vtab *)(ulong)uVar3;
            bVar4 = false;
            iVar15 = 0;
            goto LAB_001af4cb;
          }
          uVar13 = (ulong)uVar10;
          puVar16 = puVar16 + -6;
          iVar14 = iVar14 + 1;
          uVar10 = uVar10 - 1;
        } while ((uint)psVar11[uVar13].nRef <= uVar7);
        iVar15 = -iVar14;
        *(int *)((long)&cur[3].pVtab + 4) = iVar15;
        cur[10].pVtab = (sqlite3_vtab *)(ulong)uVar3;
        bVar4 = false;
      }
    }
LAB_001af4cb:
    bVar5 = true;
    if (!bVar4) {
      if (bVar17) {
        bVar6 = 0;
      }
      else {
        bVar6 = *(byte *)((long)&(cur[0x18].pVtab)->pModule +
                         (ulong)*(uint *)((long)&cur[5].pVtab[iVar15 - 1].pModule + 4)) & 0xf;
      }
      *(byte *)&cur[3].pVtab = bVar6;
    }
  }
  if (!bVar5) {
    return 7;
  }
LAB_001af502:
  if ((*(char *)&cur[3].pVtab == '\v') && (iVar15 = *(int *)((long)&cur[3].pVtab + 4), iVar15 != 0))
  {
    ppcVar2 = &cur[5].pVtab[iVar15 - 1].zErrMsg;
    *ppcVar2 = *ppcVar2 + 1;
  }
  *(int *)&cur[1].pVtab = *(int *)&cur[1].pVtab + 1;
  return iVar12;
}

Assistant:

static int jsonEachNext(sqlite3_vtab_cursor *cur){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  int rc = SQLITE_OK;
  if( p->bRecursive ){
    u8 x;
    u8 levelChange = 0;
    u32 n, sz = 0;
    u32 i = jsonSkipLabel(p);
    x = p->sParse.aBlob[i] & 0x0f;
    n = jsonbPayloadSize(&p->sParse, i, &sz);
    if( x==JSONB_OBJECT || x==JSONB_ARRAY ){
      JsonParent *pParent;
      if( p->nParent>=p->nParentAlloc ){
        JsonParent *pNew;
        u64 nNew;
        nNew = p->nParentAlloc*2 + 3;
        pNew = sqlite3DbRealloc(p->db, p->aParent, sizeof(JsonParent)*nNew);
        if( pNew==0 ) return SQLITE_NOMEM;
        p->nParentAlloc = (u32)nNew;
        p->aParent = pNew;
      }
      levelChange = 1;
      pParent = &p->aParent[p->nParent];
      pParent->iHead = p->i;
      pParent->iValue = i;
      pParent->iEnd = i + n + sz;
      pParent->iKey = -1;
      pParent->nPath = (u32)p->path.nUsed;
      if( p->eType && p->nParent ){
        jsonAppendPathName(p);
        if( p->path.eErr ) rc = SQLITE_NOMEM;
      }
      p->nParent++;
      p->i = i + n;
    }else{
      p->i = i + n + sz;
    }
    while( p->nParent>0 && p->i >= p->aParent[p->nParent-1].iEnd ){
      p->nParent--;
      p->path.nUsed = p->aParent[p->nParent].nPath;
      levelChange = 1;
    }
    if( levelChange ){
      if( p->nParent>0 ){
        JsonParent *pParent = &p->aParent[p->nParent-1];
        u32 iVal = pParent->iValue;
        p->eType = p->sParse.aBlob[iVal] & 0x0f;
      }else{
        p->eType = 0;
      }
    }
  }else{
    u32 n, sz = 0;
    u32 i = jsonSkipLabel(p);
    n = jsonbPayloadSize(&p->sParse, i, &sz);
    p->i = i + n + sz;
  }
  if( p->eType==JSONB_ARRAY && p->nParent ){
    p->aParent[p->nParent-1].iKey++;
  }
  p->iRowid++;
  return rc;
}